

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionTicketThreads_Test::TestBody
          (SSLVersionTest_SessionTicketThreads_Test *this)

{
  undefined8 uVar1;
  TestPartResultReporterInterface *pTVar2;
  UniquePtr<SSL_SESSION> UVar3;
  bool bVar4;
  size_type sVar5;
  pointer ptVar6;
  thread *ptVar7;
  allocator_type *__a;
  long lVar8;
  anon_class_8_1_e77a0050_for__M_head_impl *__args;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_00;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_01;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_02;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_03;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_04;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_05;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_04;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_06;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_05;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_07;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_06;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_08;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_09;
  allocator_type *paVar9;
  char *in_R9;
  thread *thread;
  TestPartResultReporterInterface TVar10;
  ScopedTrace gtest_trace_6663;
  bool renew_ticket;
  AssertionResult gtest_ar_;
  anon_class_8_1_8991fb9c connect_with_session;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type sStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  UniquePtr<SSL_SESSION> session2;
  undefined2 local_62;
  UniquePtr<SSL_SESSION> session1;
  AssertHelper local_38;
  
  local_62 = 0x100;
  lVar8 = 0;
  while( true ) {
    if (lVar8 == 2) {
      return;
    }
    renew_ticket = *(bool *)((long)&local_62 + lVar8);
    testing::ScopedTrace::ScopedTrace<bool>
              (&gtest_trace_6663,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a07,&renew_ticket);
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) break;
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
    }
    bVar4 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar4 != false) break;
    SSL_CTX_set_session_cache_mode
              ((this->super_SSLVersionTest).client_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
    SSL_CTX_set_session_cache_mode
              ((this->super_SSLVersionTest).server_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
    if (renew_ticket == true) {
      SSL_CTX_set_tlsext_ticket_key_cb
                ((this->super_SSLVersionTest).server_ctx_._M_t.
                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,RenewTicketCallback);
    }
    local_a8._8_8_ = 0;
    sStack_90 = 0;
    local_88._8_8_ = 0;
    gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface = (_func_int **)0x0;
    gtest_fatal_failure_checker.has_new_fatal_failure_ = false;
    gtest_fatal_failure_checker._9_7_ = 0;
    local_a8._M_allocated_capacity = 0;
    local_88._M_allocated_capacity = 0;
    local_78._0_4_ = 0;
    local_78._4_1_ = false;
    local_78._5_3_ = 0;
    gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)&local_a8;
    local_98._M_p = (pointer)&local_88;
    CreateClientSession((anon_unknown_0 *)&session1,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)&gtest_fatal_failure_checker);
    ClientConfig::~ClientConfig((ClientConfig *)&gtest_fatal_failure_checker);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
         session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&session2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                 (AssertionResult *)0x2fd561,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&connect_with_session,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a12,(char *)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&connect_with_session,(Message *)&session2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&connect_with_session);
      std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
      if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
          session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)session2._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session1);
      goto LAB_0019bf4a;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_a8._8_8_ = 0;
    sStack_90 = 0;
    local_88._8_8_ = 0;
    gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface = (_func_int **)0x0;
    gtest_fatal_failure_checker.has_new_fatal_failure_ = false;
    gtest_fatal_failure_checker._9_7_ = 0;
    local_a8._M_allocated_capacity = 0;
    local_88._M_allocated_capacity = 0;
    local_78._0_4_ = 0;
    local_78._4_1_ = false;
    local_78._5_3_ = 0;
    gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)&local_a8;
    local_98._M_p = (pointer)&local_88;
    CreateClientSession((anon_unknown_0 *)&session2,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)&gtest_fatal_failure_checker);
    ClientConfig::~ClientConfig((ClientConfig *)&gtest_fatal_failure_checker);
    UVar3 = session2;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
         session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&connect_with_session);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                 (AssertionResult *)0x2fd572,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a15,(char *)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&connect_with_session);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
      if (connect_with_session.this != (SSLVersionTest_SessionTicketThreads_Test *)0x0) {
        (*((connect_with_session.this)->super_SSLVersionTest).
          super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.super_Test._vptr_Test[1])()
        ;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface = (_func_int **)0x0;
      gtest_fatal_failure_checker.has_new_fatal_failure_ = false;
      gtest_fatal_failure_checker._9_7_ = 0;
      gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)0x0;
      gtest_ar_._0_8_ = &connect_with_session;
      connect_with_session.this = this;
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         &gtest_fatal_failure_checker,1,"vector::_M_realloc_insert");
      uVar1 = gtest_fatal_failure_checker._8_8_;
      TVar10 = gtest_fatal_failure_checker.super_TestPartResultReporterInterface;
      ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                         ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                          &gtest_fatal_failure_checker,sVar5);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__0>
                ((allocator_type *)
                 ((long)ptVar6 - (long)TVar10._vptr_TestPartResultReporterInterface),
                 (thread *)&gtest_ar_,__args);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         ((thread *)TVar10._vptr_TestPartResultReporterInterface,(thread *)0x0,
                          ptVar6,(allocator<std::thread> *)&gtest_fatal_failure_checker);
      __a = (allocator_type *)
            std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                      ((thread *)0x0,(thread *)uVar1,ptVar7 + 1,
                       (allocator<std::thread> *)&gtest_fatal_failure_checker);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                 &gtest_fatal_failure_checker,(pointer)TVar10._vptr_TestPartResultReporterInterface,
                 (long)gtest_fatal_failure_checker.original_reporter_ -
                 (long)TVar10._vptr_TestPartResultReporterInterface >> 3);
      paVar9 = (allocator_type *)(ptVar6 + sVar5);
      gtest_ar_._0_8_ = &connect_with_session;
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface = (_func_int **)ptVar6;
      gtest_fatal_failure_checker._8_8_ = __a;
      gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)paVar9;
      if (__a == paVar9) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           &gtest_fatal_failure_checker,1,"vector::_M_realloc_insert");
        uVar1 = gtest_fatal_failure_checker._8_8_;
        TVar10._vptr_TestPartResultReporterInterface =
             gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
             _vptr_TestPartResultReporterInterface;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                            &gtest_fatal_failure_checker,sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__1>
                  ((allocator_type *)
                   (((long)paVar9 - (long)TVar10._vptr_TestPartResultReporterInterface) +
                   (long)ptVar6),(thread *)&gtest_ar_,__args_01);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)TVar10._vptr_TestPartResultReporterInterface,(thread *)__a,
                            ptVar6,(allocator<std::thread> *)&gtest_fatal_failure_checker);
        paVar9 = (allocator_type *)
                 std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)__a,(thread *)uVar1,ptVar7 + 1,
                            (allocator<std::thread> *)&gtest_fatal_failure_checker);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                   &gtest_fatal_failure_checker,
                   (pointer)TVar10._vptr_TestPartResultReporterInterface,
                   (long)gtest_fatal_failure_checker.original_reporter_ -
                   (long)TVar10._vptr_TestPartResultReporterInterface >> 3);
        gtest_fatal_failure_checker.original_reporter_ =
             (TestPartResultReporterInterface *)(ptVar6 + sVar5);
        __args_02 = extraout_RDX_00;
        gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface = (_func_int **)ptVar6;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__1>
                  (__a,(thread *)&gtest_ar_,__args_00);
        paVar9 = (allocator_type *)(gtest_fatal_failure_checker._8_8_ + 8);
        __args_02 = extraout_RDX;
      }
      pTVar2 = gtest_fatal_failure_checker.original_reporter_;
      gtest_ar_._0_8_ = &connect_with_session;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )&session1;
      gtest_fatal_failure_checker._8_8_ = paVar9;
      if (paVar9 == (allocator_type *)gtest_fatal_failure_checker.original_reporter_) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           &gtest_fatal_failure_checker,1,"vector::_M_realloc_insert");
        uVar1 = gtest_fatal_failure_checker._8_8_;
        TVar10 = gtest_fatal_failure_checker.super_TestPartResultReporterInterface;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                            &gtest_fatal_failure_checker,sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__2>
                  ((allocator_type *)
                   (((long)pTVar2 - (long)TVar10._vptr_TestPartResultReporterInterface) +
                   (long)ptVar6),(thread *)&gtest_ar_,__args_03);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)TVar10._vptr_TestPartResultReporterInterface,(thread *)paVar9,
                            ptVar6,(allocator<std::thread> *)&gtest_fatal_failure_checker);
        paVar9 = (allocator_type *)
                 std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)paVar9,(thread *)uVar1,ptVar7 + 1,
                            (allocator<std::thread> *)&gtest_fatal_failure_checker);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                   &gtest_fatal_failure_checker,
                   (pointer)TVar10._vptr_TestPartResultReporterInterface,
                   (long)gtest_fatal_failure_checker.original_reporter_ -
                   (long)TVar10._vptr_TestPartResultReporterInterface >> 3);
        gtest_fatal_failure_checker.original_reporter_ =
             (TestPartResultReporterInterface *)(ptVar6 + sVar5);
        __args_04 = extraout_RDX_02;
        gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface = (_func_int **)ptVar6;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__2>
                  (paVar9,(thread *)&gtest_ar_,__args_02);
        paVar9 = (allocator_type *)(gtest_fatal_failure_checker._8_8_ + 8);
        __args_04 = extraout_RDX_01;
      }
      pTVar2 = gtest_fatal_failure_checker.original_reporter_;
      gtest_ar_._0_8_ = &connect_with_session;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )&session1;
      gtest_fatal_failure_checker._8_8_ = paVar9;
      if (paVar9 == (allocator_type *)gtest_fatal_failure_checker.original_reporter_) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           &gtest_fatal_failure_checker,1,"vector::_M_realloc_insert");
        uVar1 = gtest_fatal_failure_checker._8_8_;
        TVar10 = gtest_fatal_failure_checker.super_TestPartResultReporterInterface;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                            &gtest_fatal_failure_checker,sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__3>
                  ((allocator_type *)
                   (((long)pTVar2 - (long)TVar10._vptr_TestPartResultReporterInterface) +
                   (long)ptVar6),(thread *)&gtest_ar_,__args_05);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)TVar10._vptr_TestPartResultReporterInterface,(thread *)paVar9,
                            ptVar6,(allocator<std::thread> *)&gtest_fatal_failure_checker);
        paVar9 = (allocator_type *)
                 std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)paVar9,(thread *)uVar1,ptVar7 + 1,
                            (allocator<std::thread> *)&gtest_fatal_failure_checker);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                   &gtest_fatal_failure_checker,
                   (pointer)TVar10._vptr_TestPartResultReporterInterface,
                   (long)gtest_fatal_failure_checker.original_reporter_ -
                   (long)TVar10._vptr_TestPartResultReporterInterface >> 3);
        gtest_fatal_failure_checker.original_reporter_ =
             (TestPartResultReporterInterface *)(ptVar6 + sVar5);
        __args_06 = extraout_RDX_04;
        gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface = (_func_int **)ptVar6;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__3>
                  (paVar9,(thread *)&gtest_ar_,__args_04);
        paVar9 = (allocator_type *)(gtest_fatal_failure_checker._8_8_ + 8);
        __args_06 = extraout_RDX_03;
      }
      pTVar2 = gtest_fatal_failure_checker.original_reporter_;
      gtest_ar_._0_8_ = &connect_with_session;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )&session2;
      gtest_fatal_failure_checker._8_8_ = paVar9;
      if (paVar9 == (allocator_type *)gtest_fatal_failure_checker.original_reporter_) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           &gtest_fatal_failure_checker,1,"vector::_M_realloc_insert");
        uVar1 = gtest_fatal_failure_checker._8_8_;
        TVar10 = gtest_fatal_failure_checker.super_TestPartResultReporterInterface;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                            &gtest_fatal_failure_checker,sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__4>
                  ((allocator_type *)
                   (((long)pTVar2 - (long)TVar10._vptr_TestPartResultReporterInterface) +
                   (long)ptVar6),(thread *)&gtest_ar_,__args_07);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)TVar10._vptr_TestPartResultReporterInterface,(thread *)paVar9,
                            ptVar6,(allocator<std::thread> *)&gtest_fatal_failure_checker);
        paVar9 = (allocator_type *)
                 std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)paVar9,(thread *)uVar1,ptVar7 + 1,
                            (allocator<std::thread> *)&gtest_fatal_failure_checker);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                   &gtest_fatal_failure_checker,
                   (pointer)TVar10._vptr_TestPartResultReporterInterface,
                   (long)gtest_fatal_failure_checker.original_reporter_ -
                   (long)TVar10._vptr_TestPartResultReporterInterface >> 3);
        gtest_fatal_failure_checker.original_reporter_ =
             (TestPartResultReporterInterface *)(ptVar6 + sVar5);
        __args_08 = extraout_RDX_06;
        gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface = (_func_int **)ptVar6;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__4>
                  (paVar9,(thread *)&gtest_ar_,__args_06);
        paVar9 = (allocator_type *)(gtest_fatal_failure_checker._8_8_ + 8);
        __args_08 = extraout_RDX_05;
      }
      pTVar2 = gtest_fatal_failure_checker.original_reporter_;
      gtest_ar_._0_8_ = &connect_with_session;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )&session2;
      gtest_fatal_failure_checker._8_8_ = paVar9;
      if (paVar9 == (allocator_type *)gtest_fatal_failure_checker.original_reporter_) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           &gtest_fatal_failure_checker,1,"vector::_M_realloc_insert");
        uVar1 = gtest_fatal_failure_checker._8_8_;
        TVar10 = gtest_fatal_failure_checker.super_TestPartResultReporterInterface;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                            &gtest_fatal_failure_checker,sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__5>
                  ((allocator_type *)
                   (((long)pTVar2 - (long)TVar10._vptr_TestPartResultReporterInterface) +
                   (long)ptVar6),(thread *)&gtest_ar_,__args_09);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)TVar10._vptr_TestPartResultReporterInterface,(thread *)paVar9,
                            ptVar6,(allocator<std::thread> *)&gtest_fatal_failure_checker);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)paVar9,(thread *)uVar1,ptVar7 + 1,
                            (allocator<std::thread> *)&gtest_fatal_failure_checker);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)
                   &gtest_fatal_failure_checker,
                   (pointer)TVar10._vptr_TestPartResultReporterInterface,
                   (long)gtest_fatal_failure_checker.original_reporter_ -
                   (long)TVar10._vptr_TestPartResultReporterInterface >> 3);
        gtest_fatal_failure_checker.original_reporter_ =
             (TestPartResultReporterInterface *)(ptVar6 + sVar5);
        gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface = (_func_int **)ptVar6;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__5>
                  (paVar9,(thread *)&gtest_ar_,__args_08);
        ptVar7 = (thread *)(gtest_fatal_failure_checker._8_8_ + 8);
      }
      gtest_fatal_failure_checker._8_8_ = ptVar7;
      for (TVar10._vptr_TestPartResultReporterInterface =
                gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface;
          (thread *)TVar10._vptr_TestPartResultReporterInterface != ptVar7;
          TVar10._vptr_TestPartResultReporterInterface =
               TVar10._vptr_TestPartResultReporterInterface + 1) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&gtest_fatal_failure_checker);
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session2);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session1);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_6663);
    lVar8 = lVar8 + 1;
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        UVar3._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      return;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
             ,0x1a08,
             "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar_,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_0019bf4a:
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_6663);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionTicketThreads) {
  for (bool renew_ticket : {false, true}) {
    SCOPED_TRACE(renew_ticket);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());
    SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
    SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
    if (renew_ticket) {
      SSL_CTX_set_tlsext_ticket_key_cb(server_ctx_.get(), RenewTicketCallback);
    }

    // Establish two client sessions to test with.
    bssl::UniquePtr<SSL_SESSION> session1 =
        CreateClientSession(client_ctx_.get(), server_ctx_.get());
    ASSERT_TRUE(session1);
    bssl::UniquePtr<SSL_SESSION> session2 =
        CreateClientSession(client_ctx_.get(), server_ctx_.get());
    ASSERT_TRUE(session2);

    auto connect_with_session = [&](SSL_SESSION *session) {
      ClientConfig config;
      config.session = session;
      UniquePtr<SSL> client, server;
      ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                         server_ctx_.get(), config));
    };

    // Resume sessions in parallel with establishing new ones.
    {
      std::vector<std::thread> threads;
      threads.emplace_back([&] { connect_with_session(nullptr); });
      threads.emplace_back([&] { connect_with_session(nullptr); });
      threads.emplace_back([&] { connect_with_session(session1.get()); });
      threads.emplace_back([&] { connect_with_session(session1.get()); });
      threads.emplace_back([&] { connect_with_session(session2.get()); });
      threads.emplace_back([&] { connect_with_session(session2.get()); });
      for (auto &thread : threads) {
        thread.join();
      }
    }
  }
}